

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void continuous_dist_test_streamable<trng::truncated_normal_dist<double>>
               (truncated_normal_dist<double> *d)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  result_type_conflict2 rVar4;
  result_type_conflict2 rVar5;
  undefined4 extraout_EAX;
  int iVar6;
  AssertionHandler catchAssertionHandler;
  stringstream str;
  StringRef local_250;
  AssertionHandler local_240;
  param_type local_1f8;
  StringRef local_1c8;
  SourceLineInfo local_1b8;
  stringstream local_1a8 [16];
  basic_ostream<char,_std::char_traits<char>_> local_198 [112];
  ios_base local_128 [264];
  
  local_1f8.mu_._0_4_ = 0;
  local_1f8.mu_._4_4_ = 0;
  local_1f8.sigma_._0_4_ = 0;
  local_1f8.sigma_._4_4_ = 0x3ff00000;
  local_1f8.a_ = -INFINITY;
  local_1f8.b_ = INFINITY;
  local_1f8.Phi_a._0_4_ = 0;
  local_1f8.Phi_a._4_4_ = 0;
  local_1f8.Phi_b._0_4_ = 0;
  local_1f8.Phi_b._4_4_ = 0x3ff00000;
  trng::truncated_normal_dist<double>::param_type::update_Phi(&local_1f8);
  std::__cxx11::stringstream::stringstream(local_1a8);
  trng::operator<<(local_198,&d->P);
  trng::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_1a8,&local_1f8);
  rVar5 = local_1f8.b_;
  rVar4 = local_1f8.a_;
  dVar2 = (double)CONCAT44(local_1f8.mu_._4_4_,local_1f8.mu_._0_4_);
  dVar3 = (double)CONCAT44(local_1f8.sigma_._4_4_,local_1f8.sigma_._0_4_);
  local_250.m_start = "REQUIRE";
  local_250.m_size = 7;
  local_1b8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_1b8.line = 0xcd;
  Catch::StringRef::StringRef(&local_1c8,"(d == d_new)");
  Catch::AssertionHandler::AssertionHandler(&local_240,&local_250,&local_1b8,local_1c8,Normal);
  auVar1._4_4_ = -(uint)((d->P).sigma_ == dVar3);
  auVar1._0_4_ = -(uint)((d->P).mu_ == dVar2);
  auVar1._8_4_ = -(uint)((d->P).a_ == rVar4);
  auVar1._12_4_ = -(uint)((d->P).b_ == rVar5);
  iVar6 = movmskps(extraout_EAX,auVar1);
  local_250.m_start = (char *)CONCAT71(local_250.m_start._1_7_,iVar6 == 0xf);
  Catch::AssertionHandler::handleExpr<bool>(&local_240,(ExprLhs<bool> *)&local_250);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}